

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

string * __thiscall
t_haxe_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_field *tfield,bool init)

{
  undefined8 type;
  byte bVar1;
  uint uVar2;
  string *psVar3;
  t_type *ptVar4;
  t_const_value *ptVar5;
  undefined8 *puVar6;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  t_base local_324;
  undefined1 local_320 [4];
  t_base tbase;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  ofstream dummy;
  t_type *ttype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string result;
  bool init_local;
  t_field *tfield_local;
  t_haxe_generator *this_local;
  
  result.field_2._M_local_buf[0xf] = init;
  psVar3 = t_field::get_name_abi_cxx11_(tfield);
  std::operator+(&local_88,"var ",psVar3);
  std::operator+(&local_68,&local_88," : ");
  ptVar4 = t_field::get_type(tfield);
  type_name_abi_cxx11_((string *)&ttype,this,ptVar4,false,false);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ttype);
  std::__cxx11::string::~string((string *)&ttype);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if ((result.field_2._M_local_buf[0xf] & 1U) != 0) {
    ptVar4 = t_field::get_type(tfield);
    dummy._504_8_ = t_generator::get_true_type(ptVar4);
    uVar2 = (*(((t_type *)dummy._504_8_)->super_t_doc)._vptr_t_doc[5])();
    if (((uVar2 & 1) == 0) || (ptVar5 = t_field::get_value(tfield), ptVar5 == (t_const_value *)0x0))
    {
      bVar1 = (**(code **)(*(long *)dummy._504_8_ + 0x28))();
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)dummy._504_8_ + 0x50))();
        if ((bVar1 & 1) == 0) {
          bVar1 = (**(code **)(*(long *)dummy._504_8_ + 0x68))();
          if ((bVar1 & 1) == 0) {
            type_name_abi_cxx11_(&local_3e8,this,(t_type *)dummy._504_8_,false,true);
            std::operator+(&local_3c8," = new ",&local_3e8);
            std::operator+(&local_3a8,&local_3c8,"()");
            std::__cxx11::string::operator+=((string *)local_48,(string *)&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::__cxx11::string::~string((string *)&local_3c8);
            std::__cxx11::string::~string((string *)&local_3e8);
          }
          else {
            type_name_abi_cxx11_(&local_388,this,(t_type *)dummy._504_8_,false,true);
            std::operator+(&local_368," = new ",&local_388);
            std::operator+(&local_348,&local_368,"()");
            std::__cxx11::string::operator+=((string *)local_48,(string *)&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_368);
            std::__cxx11::string::~string((string *)&local_388);
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)local_48," = 0");
        }
      }
      else {
        local_324 = t_base_type::get_base((t_base_type *)dummy._504_8_);
        switch(local_324) {
        case TYPE_VOID:
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "NO T_VOID CONSTRUCT";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        case TYPE_STRING:
          std::__cxx11::string::operator+=((string *)local_48," = null");
          break;
        case TYPE_BOOL:
          std::__cxx11::string::operator+=((string *)local_48," = false");
          break;
        case TYPE_I8:
        case TYPE_I16:
        case TYPE_I32:
        case TYPE_I64:
          std::__cxx11::string::operator+=((string *)local_48," = 0");
          break;
        case TYPE_DOUBLE:
          std::__cxx11::string::operator+=((string *)local_48," = (double)0");
        }
      }
    }
    else {
      std::ofstream::ofstream(local_2c0);
      psVar3 = t_field::get_name_abi_cxx11_(tfield);
      std::__cxx11::string::string((string *)local_320,(string *)psVar3);
      type = dummy._504_8_;
      ptVar5 = t_field::get_value(tfield);
      render_const_value(&local_300,this,(ostream *)local_2c0,(string *)local_320,(t_type *)type,
                         ptVar5);
      std::operator+(&local_2e0," = ",&local_300);
      std::__cxx11::string::operator+=((string *)local_48,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)local_320);
      std::ofstream::~ofstream(local_2c0);
    }
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,";");
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::declare_field(t_field* tfield, bool init) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "var " + tfield->get_name() + " : " + type_name(tfield->get_type());
  if (init) {
    t_type* ttype = get_true_type(tfield->get_type());
    if (ttype->is_base_type() && tfield->get_value() != nullptr) {
      std::ofstream dummy;
      result += " = " + render_const_value(dummy, tfield->get_name(), ttype, tfield->get_value());
    } else if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "NO T_VOID CONSTRUCT";
      case t_base_type::TYPE_STRING:
        result += " = null";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = (double)0";
        break;
      }

    } else if (ttype->is_enum()) {
      result += " = 0";
    } else if (ttype->is_container()) {
      result += " = new " + type_name(ttype, false, true) + "()";
    } else {
      result += " = new " + type_name(ttype, false, true) + "()";
    }
  }
  return result + ";";
}